

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O0

void __thiscall
cmCTestCVS::LoadRevisions
          (cmCTestCVS *this,string *file,char *branchFlag,
          vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revisions)

{
  pointer *this_00;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  cmCTest *this_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ostream *this_03;
  char *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b80;
  string local_b10;
  undefined1 local_af0 [8];
  OutputLogger err;
  LogParser out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  iterator local_218;
  size_type local_210;
  undefined1 local_208 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cvs_log;
  string cvs;
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  vector<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_> *revisions_local;
  char *branchFlag_local;
  string *file_local;
  cmCTestCVS *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  this_03 = std::operator<<((ostream *)local_1a0,".");
  std::ostream::operator<<(this_03,std::flush<char,std::char_traits<char>>);
  this_02 = (this->super_cmCTestVC).CTest;
  std::__cxx11::ostringstream::str();
  msg = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(this_02,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestCVS.cxx"
               ,0xdb,msg,false);
  std::__cxx11::string::~string((string *)(cvs.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  this_00 = &cvs_log.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::string((string *)this_00,(string *)&(this->super_cmCTestVC).CommandLineTool)
  ;
  out.Rev.Log.field_2._M_local_buf[0xc] = '\x01';
  std::__cxx11::string::string((string *)&local_2b8,(string *)this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_298,"log",(allocator<char> *)(out.Rev.Log.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_278,"-N",(allocator<char> *)(out.Rev.Log.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,branchFlag,(allocator<char> *)(out.Rev.Log.field_2._M_local_buf + 0xd));
  std::__cxx11::string::string(local_238,(string *)file);
  out.Rev.Log.field_2._M_local_buf[0xc] = '\0';
  local_218 = &local_2b8;
  local_210 = 5;
  this_01 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(out.Rev.Log.field_2._M_local_buf + 0xb);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(this_01);
  __l._M_len = local_210;
  __l._M_array = local_218;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_208,__l,this_01);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)(out.Rev.Log.field_2._M_local_buf + 0xb));
  local_b80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_218;
  do {
    local_b80 = local_b80 + -1;
    std::__cxx11::string::~string((string *)local_b80);
  } while (local_b80 != &local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)(out.Rev.Log.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(out.Rev.Log.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(out.Rev.Log.field_2._M_local_buf + 0xf));
  LogParser::LogParser((LogParser *)&err.super_LineParser.Separator,this,"log-out> ",revisions);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_af0,(this->super_cmCTestVC).Log,"log-err> ");
  std::__cxx11::string::string((string *)&local_b10);
  cmCTestVC::RunChild(&this->super_cmCTestVC,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_208,(OutputParser *)&err.super_LineParser.Separator,
                      (OutputParser *)local_af0,&local_b10,Auto);
  std::__cxx11::string::~string((string *)&local_b10);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_af0);
  LogParser::~LogParser((LogParser *)&err.super_LineParser.Separator);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_208);
  std::__cxx11::string::~string
            ((string *)
             &cvs_log.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void cmCTestCVS::LoadRevisions(std::string const& file, const char* branchFlag,
                               std::vector<Revision>& revisions)
{
  cmCTestLog(this->CTest, HANDLER_OUTPUT, "." << std::flush);

  // Run "cvs log" to get revisions of this file on this branch.
  std::string cvs = this->CommandLineTool;
  std::vector<std::string> cvs_log = { cvs, "log", "-N", branchFlag, file };

  LogParser out(this, "log-out> ", revisions);
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(cvs_log, &out, &err);
}